

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

void __thiscall
pbrt::ZSobolSampler::ZSobolSampler
          (ZSobolSampler *this,int samplesPerPixel,Point2i fullResolution,
          RandomizeStrategy randomizeStrategy,int seed)

{
  uint uVar1;
  int iVar2;
  string ret;
  int local_3c;
  string local_38;
  
  this->randomizeStrategy = randomizeStrategy;
  this->seed = seed;
  if (POPCOUNT(samplesPerPixel) != 1) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_3c = samplesPerPixel;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    detail::stringPrintfRecursive<int&>
              (&local_38,
               "Rounding %d up to the next power of two for \"zsobol\" sampler samples per pixel.",
               &local_3c);
    Warning((FileLoc *)0x0,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
    uVar1 = (int)(local_3c - 1U) >> 1 | local_3c - 1U;
    uVar1 = (int)uVar1 >> 2 | uVar1;
    uVar1 = (int)uVar1 >> 4 | uVar1;
    uVar1 = (int)uVar1 >> 8 | uVar1;
    samplesPerPixel = ((int)uVar1 >> 0x10 | uVar1) + 1;
  }
  iVar2 = fullResolution.super_Tuple2<pbrt::Point2,_int>.y;
  if (fullResolution.super_Tuple2<pbrt::Point2,_int>.y <
      fullResolution.super_Tuple2<pbrt::Point2,_int>.x) {
    iVar2 = fullResolution.super_Tuple2<pbrt::Point2,_int>.x;
  }
  this->log2SamplesPerPixel = LZCOUNT(samplesPerPixel) ^ 0x1f;
  uVar1 = (int)(iVar2 - 1U) >> 1 | iVar2 - 1U;
  uVar1 = (int)uVar1 >> 2 | uVar1;
  uVar1 = (int)uVar1 >> 4 | uVar1;
  uVar1 = (int)uVar1 >> 8 | uVar1;
  this->nBase4Digits =
       (LZCOUNT(((int)uVar1 >> 0x10 | uVar1) + 1) ^ 0x1fU) + (0x20U - LZCOUNT(samplesPerPixel) >> 1)
  ;
  return;
}

Assistant:

ZSobolSampler(int samplesPerPixel, Point2i fullResolution,
                  RandomizeStrategy randomizeStrategy = RandomizeStrategy::PermuteDigits,
                  int seed = 0)
        : randomizeStrategy(randomizeStrategy), seed(seed) {
        if (!IsPowerOf2(samplesPerPixel)) {
            Warning("Rounding %d up to the next power of two for \"zsobol\" sampler "
                    "samples per pixel.",
                    samplesPerPixel);
            samplesPerPixel = RoundUpPow2(samplesPerPixel);
        }
        log2SamplesPerPixel = Log2Int(samplesPerPixel);

        int res = RoundUpPow2(std::max(fullResolution.x, fullResolution.y));
        int log4SamplesPerPixel = (log2SamplesPerPixel + 1) / 2;
        nBase4Digits = Log2Int(res) + log4SamplesPerPixel;
    }